

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
::find<std::__cxx11::string>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 *puVar6;
  bool bVar7;
  ushort uVar8;
  MixingHashState MVar9;
  slot_type *ppDVar10;
  anon_union_8_1_a8a14541_for_iterator_2 in_RDX;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  anon_union_8_1_a8a14541_for_iterator_2 slot;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX_00;
  slot_type *slot_00;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX_01;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX_02;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX_03;
  ulong i;
  uint uVar11;
  undefined1 uVar12;
  uint64_t v;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  key_arg<std::__cxx11::basic_string<char>_> *unaff_R15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  iterator iVar19;
  iterator iVar20;
  anon_class_24_3_2b146c49 assert_consistent;
  __m128i match;
  size_t hash_of_arg;
  ulong local_b8;
  anon_class_24_3_2b146c49 local_98;
  ctrl_t *local_80;
  anon_union_8_1_a8a14541_for_iterator_2 local_78;
  anon_class_24_3_2b146c49 local_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  anon_union_8_1_a8a14541_for_iterator_2 local_38;
  
  if (1 < *(ulong *)(this + 8)) {
    sVar2 = key->_M_string_length;
    MVar9 = hash_internal::MixingHashState::combine_contiguous
                      ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                       (uchar *)(key->_M_dataplus)._M_p,sVar2);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = MVar9.state_ + sVar2;
    in_RDX.slot_ = (slot_type *)
                   (SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),8) ^
                   SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),0));
    local_70.hash_of_arg = (size_t *)&local_38;
    uVar13 = *(ulong *)this;
    unaff_R15 = key;
    local_70.key = key;
    local_70.this =
         (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)this;
    local_38.slot_ = in_RDX.slot_;
    if (uVar13 == 1) {
      ppDVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             *)this);
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::
      AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::anon_class_24_3_2b146c49::operator()(&local_70,(ctrl_t *)ppDVar10,slot_00);
      in_RDX = extraout_RDX_01;
    }
    else {
      if (uVar13 == 0) goto LAB_001f75d4;
      if (uVar13 < 0x11) {
        unaff_R15 = (key_arg<std::__cxx11::basic_string<char>_> *)
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                  *)this);
        local_98.hash_of_arg = local_70.hash_of_arg;
        local_98.key = local_70.key;
        local_98.this = local_70.this;
        uVar13 = *(ulong *)this;
        pauVar15 = *(undefined1 (**) [16])(this + 0x10);
        in_RDX = extraout_RDX;
        if (uVar13 < 0xf) {
          if (8 < uVar13) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar13 = *(ulong *)(*pauVar15 + uVar13) & 0x8080808080808080;
          if (uVar13 != 0x8080808080808080) {
            unaff_R15 = (key_arg<std::__cxx11::basic_string<char>_> *)
                        ((long)&unaff_R15[-1].field_2 + 8);
            uVar13 = uVar13 ^ 0x8080808080808080;
            slot = extraout_RDX;
            do {
              lVar4 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::
              AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::anon_class_24_3_2b146c49::operator()
                        (&local_98,
                         (ctrl_t *)
                         ((long)&(unaff_R15->_M_dataplus)._M_p + (ulong)((uint)lVar4 & 0xfffffff8)),
                         slot.slot_);
              uVar13 = uVar13 & uVar13 - 1;
              slot = extraout_RDX_00;
              in_RDX = extraout_RDX_00;
            } while (uVar13 != 0);
          }
        }
        else {
          uVar13 = *(ulong *)(this + 8) >> 1;
          if (1 < *(ulong *)(this + 8)) {
            uVar14 = uVar13;
            while( true ) {
              auVar16 = *pauVar15;
              uVar11 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar16[0xf] >> 7) << 0xf);
              if (uVar11 != 0xffff) {
                uVar11 = ~uVar11;
                do {
                  uVar3 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                    }
                  }
                  if ((char)(*pauVar15)[uVar3] < '\0') {
                    __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x764,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                                 );
                  }
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ::
                  AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::anon_class_24_3_2b146c49::operator()
                            (&local_98,(ctrl_t *)(&unaff_R15->_M_dataplus + uVar3),in_RDX.slot_);
                  uVar14 = uVar14 - 1;
                  uVar8 = (ushort)(uVar11 - 1) & (ushort)uVar11;
                  uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar8);
                  in_RDX = extraout_RDX_03;
                } while (uVar8 != 0);
              }
              if (uVar14 == 0) break;
              unaff_R15 = unaff_R15 + 4;
              puVar6 = *pauVar15;
              pauVar15 = pauVar15 + 1;
              if (puVar6[0xf] == -1) {
                __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x76b,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
            }
          }
          if (uVar13 < *(ulong *)(this + 8) >> 1) {
            __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x770,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
  }
  if (*(long *)this != 1) {
    if (*(long *)this != 0) {
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::prefetch_heap_block
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)this);
      sVar2 = key->_M_string_length;
      MVar9 = hash_internal::MixingHashState::combine_contiguous
                        ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                         (uchar *)(key->_M_dataplus)._M_p,sVar2);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = MVar9.state_ + sVar2;
      uVar13 = *(ulong *)this;
      if (uVar13 == 1) {
        __assert_fail("!is_soo()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdb0,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = std::basic_string<char>]"
                     );
      }
      if (uVar13 != 0) {
        if ((uVar13 + 1 & uVar13) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x145,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar14 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
        local_b8 = (uVar14 >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar13;
        local_80 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                              *)this);
        uVar12 = (undefined1)uVar14;
        auVar16 = ZEXT216(CONCAT11(uVar12,uVar12) & 0x7f7f);
        auVar16 = pshuflw(auVar16,auVar16,0);
        local_58 = auVar16._0_4_;
        uVar14 = 0;
        uStack_54 = local_58;
        uStack_50 = local_58;
        uStack_4c = local_58;
        do {
          pcVar1 = local_80 + local_b8;
          local_48 = *pcVar1;
          cStack_47 = pcVar1[1];
          cStack_46 = pcVar1[2];
          cStack_45 = pcVar1[3];
          cStack_44 = pcVar1[4];
          cStack_43 = pcVar1[5];
          cStack_42 = pcVar1[6];
          cStack_41 = pcVar1[7];
          cStack_40 = pcVar1[8];
          cStack_3f = pcVar1[9];
          cStack_3e = pcVar1[10];
          cStack_3d = pcVar1[0xb];
          cStack_3c = pcVar1[0xc];
          cStack_3b = pcVar1[0xd];
          cStack_3a = pcVar1[0xe];
          cStack_39 = pcVar1[0xf];
          auVar17[0] = -((ctrl_t)local_58 == local_48);
          auVar17[1] = -(local_58._1_1_ == cStack_47);
          auVar17[2] = -(local_58._2_1_ == cStack_46);
          auVar17[3] = -(local_58._3_1_ == cStack_45);
          auVar17[4] = -((ctrl_t)uStack_54 == cStack_44);
          auVar17[5] = -(uStack_54._1_1_ == cStack_43);
          auVar17[6] = -(uStack_54._2_1_ == cStack_42);
          auVar17[7] = -(uStack_54._3_1_ == cStack_41);
          auVar17[8] = -((ctrl_t)uStack_50 == cStack_40);
          auVar17[9] = -(uStack_50._1_1_ == cStack_3f);
          auVar17[10] = -(uStack_50._2_1_ == cStack_3e);
          auVar17[0xb] = -(uStack_50._3_1_ == cStack_3d);
          auVar17[0xc] = -((ctrl_t)uStack_4c == cStack_3c);
          auVar17[0xd] = -(uStack_4c._1_1_ == cStack_3b);
          auVar17[0xe] = -(uStack_4c._2_1_ == cStack_3a);
          auVar17[0xf] = -(uStack_4c._3_1_ == cStack_39);
          uVar8 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar17[0xf] >> 7) << 0xf;
          uVar11 = (uint)uVar8;
          while( true ) {
            iVar19.field_1.slot_ = local_78.slot_;
            iVar19.ctrl_ = (ctrl_t *)unaff_R15;
            if (uVar8 == 0) break;
            uVar3 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            local_98.key = key;
            local_98.this =
                 (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)this;
            ppDVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                     *)this);
            i = uVar3 + local_b8 & uVar13;
            bVar7 = hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,void>
                    ::
                    apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>::EqualElement<std::__cxx11::string>,google::protobuf::Descriptor_const*&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>>
                              ((EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_98,ppDVar10 + i);
            if (bVar7) {
              iVar19 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                      *)this,i);
              break;
            }
            uVar8 = (ushort)(uVar11 - 1) & (ushort)uVar11;
            uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar8);
          }
          local_78 = iVar19.field_1;
          unaff_R15 = (key_arg<std::__cxx11::basic_string<char>_> *)iVar19.ctrl_;
          if (uVar8 != 0) {
            bVar7 = false;
          }
          else {
            auVar18[0] = -(local_48 == kEmpty);
            auVar18[1] = -(cStack_47 == kEmpty);
            auVar18[2] = -(cStack_46 == kEmpty);
            auVar18[3] = -(cStack_45 == kEmpty);
            auVar18[4] = -(cStack_44 == kEmpty);
            auVar18[5] = -(cStack_43 == kEmpty);
            auVar18[6] = -(cStack_42 == kEmpty);
            auVar18[7] = -(cStack_41 == kEmpty);
            auVar18[8] = -(cStack_40 == kEmpty);
            auVar18[9] = -(cStack_3f == kEmpty);
            auVar18[10] = -(cStack_3e == kEmpty);
            auVar18[0xb] = -(cStack_3d == kEmpty);
            auVar18[0xc] = -(cStack_3c == kEmpty);
            auVar18[0xd] = -(cStack_3b == kEmpty);
            auVar18[0xe] = -(cStack_3a == kEmpty);
            auVar18[0xf] = -(cStack_39 == kEmpty);
            if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar18 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar18 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar18 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar18 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar18 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar18 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar18 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar18 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar18 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar18 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar18 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar18 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar18 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar18 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar18[0xf]) {
              if (*(ulong *)this == 0) goto LAB_001f75d4;
              if (*(ulong *)this < uVar14 + 0x10) {
                __assert_fail("seq.index() <= capacity() && \"full table!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xdbd,
                              "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = std::basic_string<char>]"
                             );
              }
              local_b8 = local_b8 + uVar14 + 0x10 & uVar13;
              bVar7 = true;
              uVar14 = uVar14 + 0x10;
            }
            else {
              unaff_R15 = (key_arg<std::__cxx11::basic_string<char>_> *)0x0;
              bVar7 = false;
            }
          }
        } while (bVar7);
        goto LAB_001f74e6;
      }
    }
LAB_001f75d4:
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                 );
  }
  local_78 = in_RDX;
  if (1 < *(ulong *)(this + 8)) {
    local_98.key = key;
    local_98.this =
         (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)this;
    ppDVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)this);
    bVar7 = hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,void>
            ::
            apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>::EqualElement<std::__cxx11::string>,google::protobuf::Descriptor_const*&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>>
                      ((EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,ppDVar10);
    local_78 = extraout_RDX_02;
    if (bVar7) {
      local_78.slot_ =
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)this);
      unaff_R15 = (key_arg<std::__cxx11::basic_string<char>_> *)&kSooControl;
      goto LAB_001f74e6;
    }
  }
  unaff_R15 = (key_arg<std::__cxx11::basic_string<char>_> *)0x0;
LAB_001f74e6:
  iVar20.field_1.slot_ = local_78.slot_;
  iVar20.ctrl_ = (ctrl_t *)unaff_R15;
  return iVar20;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }